

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall
spdlog::details::t_formatter<spdlog::details::scoped_padder>::format
          (t_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  ulong uVar1;
  long lVar2;
  format_decimal_result<char_*> fVar3;
  scoped_padder p;
  scoped_padder sStack_58;
  char local_30 [21];
  char acStack_1b [3];
  char *local_18;
  
  uVar1 = msg->thread_id | 1;
  lVar2 = 0x3f;
  if (uVar1 != 0) {
    for (; uVar1 >> lVar2 == 0; lVar2 = lVar2 + -1) {
    }
  }
  scoped_padder::scoped_padder
            (&sStack_58,
             (ulong)((uint)(byte)fmt::v10::detail::do_count_digits(unsigned_long)::bsr2log10[lVar2]
                    - (uint)(msg->thread_id <
                            *(ulong *)(fmt::v10::detail::do_count_digits(unsigned_long)::
                                       zero_or_powers_of_10 +
                                      (ulong)(byte)fmt::v10::detail::do_count_digits(unsigned_long)
                                                   ::bsr2log10[lVar2] * 8))),
             &(this->super_flag_formatter).padinfo_,dest);
  fVar3 = fmt::v10::detail::format_decimal<char,unsigned_long>(local_30,msg->thread_id,0x15);
  local_18 = fVar3.begin;
  lVar2 = (long)local_30 - (long)local_18;
  if (-0x16 < lVar2) {
    fmt::v10::detail::buffer<char>::append<char>
              (&dest->super_buffer<char>,local_18,local_18 + lVar2 + 0x15);
    scoped_padder::~scoped_padder(&sStack_58);
    return;
  }
  fmt::v10::detail::assert_fail
            ("/workspace/llm4binary/github/license_c_cmakelists/oneapi-src[P]level-zero/third_party/spdlog_headers/spdlog/fmt/bundled/core.h"
             ,0x189,"negative value");
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override {
        const auto field_size = ScopedPadder::count_digits(msg.thread_id);
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::append_int(msg.thread_id, dest);
    }